

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createSIn(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  long lVar1;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_d8;
  ConstantString *local_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_40;
  ConstantString *b;
  ConstantString *a;
  string *name_local;
  Value *rhs_local;
  Value *lhs_local;
  IRBuilder *this_local;
  
  a = (ConstantString *)name;
  name_local = (string *)rhs;
  rhs_local = lhs;
  lhs_local = (Value *)this;
  if (lhs == (Value *)0x0) {
    local_c8 = (ConstantString *)0x0;
  }
  else {
    local_c8 = (ConstantString *)
               __dynamic_cast(lhs,&Value::typeinfo,
                              &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0)
    ;
  }
  b = local_c8;
  if (local_c8 != (ConstantString *)0x0) {
    if (name_local == (string *)0x0) {
      local_d8 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                  *)0x0;
    }
    else {
      local_d8 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                  *)__dynamic_cast(name_local,&Value::typeinfo,
                                   &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::
                                    typeinfo,0);
    }
    local_40 = local_d8;
    if (local_d8 !=
        (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
         *)0x0) {
      ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
      ::get(&local_60,local_d8);
      ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
      ::get(&local_80,b);
      lVar1 = std::__cxx11::string::find((string *)&local_60,(ulong)&local_80);
      this_local = (IRBuilder *)getBoolean(this,lVar1 != -1);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
      return (Value *)this_local;
    }
  }
  makeName(&local_b0,this,(string *)a);
  this_local = (IRBuilder *)
               insert<flow::BinaryInstr<(flow::BinaryOperator)31,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                         (this,&rhs_local,(Value **)&name_local,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  return (Value *)this_local;
}

Assistant:

Value* IRBuilder::createSIn(Value* lhs, Value* rhs, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(b->get().find(a->get()) != std::string::npos);

  return insert<SInInstr>(lhs, rhs, makeName(name));
}